

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.h
# Opt level: O0

void __thiscall ConnmanTestMsg::AddTestNode(ConnmanTestMsg *this,CNode *node)

{
  long lVar1;
  bool bVar2;
  reference pvVar3;
  AnnotatedMixin<std::recursive_mutex> *in_RSI;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock15;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff98;
  CNode *in_stack_ffffffffffffffa0;
  array<unsigned_int,_7UL> *this_00;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffff98);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (this_01,in_RSI,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  std::vector<CNode_*,_std::allocator<CNode_*>_>::push_back
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)in_stack_ffffffffffffff98,
             (value_type *)0x5c649a);
  bVar2 = CNode::IsManualOrFullOutboundConn(in_stack_ffffffffffffffa0);
  if (bVar2) {
    this_00 = (array<unsigned_int,_7UL> *)&in_RDI[0x1d].super_unique_lock.field_0xc;
    CNetAddr::GetNetwork((CNetAddr *)in_stack_ffffffffffffffa0);
    pvVar3 = std::array<unsigned_int,_7UL>::operator[](this_00,(size_type)in_stack_ffffffffffffffa0)
    ;
    *pvVar3 = *pvVar3 + 1;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffff98);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddTestNode(CNode& node)
    {
        LOCK(m_nodes_mutex);
        m_nodes.push_back(&node);

        if (node.IsManualOrFullOutboundConn()) ++m_network_conn_counts[node.addr.GetNetwork()];
    }